

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O3

void __thiscall
Js::DiagNativeStackFrame::DiagNativeStackFrame
          (DiagNativeStackFrame *this,ScriptFunction *function,int byteCodeOffset,void *stackAddr,
          void *codeAddr)

{
  uint uVar1;
  uint uVar2;
  ScriptContext *this_00;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  FunctionBody *this_01;
  FunctionEntryPointInfo *pFVar7;
  
  (this->super_DiagStackFrame).isTopFrame = false;
  (this->super_DiagStackFrame)._vptr_DiagStackFrame = (_func_int **)&PTR__DiagStackFrame_014e4b50;
  this->m_function = function;
  this->m_byteCodeOffset = byteCodeOffset;
  this->m_stackAddr = stackAddr;
  this->m_localVarSlotsOffset = -1;
  this->m_localVarChangedOffset = -1;
  if (stackAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x1ef,"(m_stackAddr != __null)","m_stackAddr != NULL");
    if (!bVar4) goto LAB_008c50b8;
    *puVar6 = 0;
    function = this->m_function;
  }
  if ((function == (ScriptFunction *)0x0) ||
     (this_00 = (((((function->super_ScriptFunctionBase).super_JavascriptFunction.
                    super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr, this_00 == (ScriptContext *)0x0)) {
LAB_008c4fb2:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x1f1,
                                "(m_function && m_function->GetScriptContext() && m_function->GetScriptContext()->IsScriptContextInDebugMode())"
                                ,"This only supports functions in debug mode.");
    if (!bVar4) goto LAB_008c50b8;
    *puVar6 = 0;
  }
  else {
    bVar4 = ScriptContext::IsScriptContextInDebugMode(this_00);
    if (!bVar4) goto LAB_008c4fb2;
  }
  iVar5 = (*(this->super_DiagStackFrame)._vptr_DiagStackFrame[2])(this);
  this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar5));
  pFVar7 = FunctionBody::GetEntryPointFromNativeAddress(this_01,(DWORD_PTR)codeAddr);
  if (pFVar7 == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x1fb,"(0)",
                                "Failed to get entry point for native address. Most likely the frame is old/gone."
                               );
    if (!bVar4) {
LAB_008c50b8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    uVar1 = this->m_localVarSlotsOffset;
    uVar2 = this->m_localVarChangedOffset;
  }
  else {
    uVar1 = pFVar7->localVarSlotsOffset;
    this->m_localVarSlotsOffset = uVar1;
    uVar2 = pFVar7->localVarChangedOffset;
    this->m_localVarChangedOffset = uVar2;
  }
  Output::Trace(DebuggerPhase,
                L"DiagNativeStackFrame::DiagNativeStackFrame: e.p(addr %p)=%p varOff=%d changedOff=%d\n"
                ,codeAddr,pFVar7,(ulong)uVar1,(ulong)uVar2);
  return;
}

Assistant:

DiagNativeStackFrame::DiagNativeStackFrame(
        ScriptFunction* function,
        int byteCodeOffset,
        void* stackAddr,
        void *codeAddr) :
        m_function(function),
        m_byteCodeOffset(byteCodeOffset),
        m_stackAddr(stackAddr),
        m_localVarSlotsOffset(InvalidOffset),
        m_localVarChangedOffset(InvalidOffset)
    {
        Assert(m_stackAddr != NULL);
        AssertMsg(m_function && m_function->GetScriptContext() && m_function->GetScriptContext()->IsScriptContextInDebugMode(),
            "This only supports functions in debug mode.");

        FunctionEntryPointInfo * entryPointInfo = GetFunction()->GetEntryPointFromNativeAddress((DWORD_PTR)codeAddr);
        if (entryPointInfo)
        {
            m_localVarSlotsOffset = entryPointInfo->localVarSlotsOffset;
            m_localVarChangedOffset = entryPointInfo->localVarChangedOffset;
        }
        else
        {
            AssertMsg(FALSE, "Failed to get entry point for native address. Most likely the frame is old/gone.");
        }
        OUTPUT_TRACE(Js::DebuggerPhase, _u("DiagNativeStackFrame::DiagNativeStackFrame: e.p(addr %p)=%p varOff=%d changedOff=%d\n"), codeAddr, entryPointInfo, m_localVarSlotsOffset, m_localVarChangedOffset);
    }